

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<int,_27> * __thiscall
TPZManVector<int,_27>::operator=(TPZManVector<int,_27> *this,TPZManVector<int,_27> *rval)

{
  ulong uVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  
  if (this == rval) goto LAB_00ff8954;
  uVar1 = (rval->super_TPZVec<int>).fNElements;
  piVar2 = (this->super_TPZVec<int>).fStore;
  piVar5 = this->fExtAlloc;
  if (piVar2 != piVar5 && piVar2 != (int *)0x0) {
    operator_delete__(piVar2);
    (this->super_TPZVec<int>).fStore = (int *)0x0;
  }
  if ((long)uVar1 < 0x1c) {
    uVar4 = 0;
    iVar3 = 0;
    if (0 < (long)uVar1) {
      do {
        piVar5[uVar4] = rval->fExtAlloc[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      iVar3 = (int)uVar1;
      if (0x1a < uVar1) {
        uVar4 = 0;
        goto LAB_00ff8948;
      }
    }
    memset((void *)((long)this->fExtAlloc + (ulong)(uint)(iVar3 * 4)),0,
           (ulong)(iVar3 * -4 + 0x68) + 4);
    uVar4 = 0;
  }
  else {
    piVar5 = (rval->super_TPZVec<int>).fStore;
    uVar4 = uVar1;
  }
LAB_00ff8948:
  (this->super_TPZVec<int>).fStore = piVar5;
  (this->super_TPZVec<int>).fNAlloc = uVar4;
  (this->super_TPZVec<int>).fNElements = uVar1;
LAB_00ff8954:
  (rval->super_TPZVec<int>).fStore = (int *)0x0;
  (rval->super_TPZVec<int>).fNElements = 0;
  (rval->super_TPZVec<int>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}